

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O0

char * glu::getApiTypeDescription(ApiType type)

{
  bool bVar1;
  ApiType AVar2;
  ApiType local_14;
  char *pcStack_10;
  ApiType type_local;
  
  local_14.m_bits = type.m_bits;
  AVar2 = ApiType::es(2,0);
  bVar1 = ApiType::operator==(&local_14,AVar2);
  if (bVar1) {
    pcStack_10 = "OpenGL ES 2";
  }
  else {
    AVar2 = ApiType::es(3,0);
    bVar1 = ApiType::operator==(&local_14,AVar2);
    if (bVar1) {
      pcStack_10 = "OpenGL ES 3";
    }
    else {
      AVar2 = ApiType::es(3,1);
      bVar1 = ApiType::operator==(&local_14,AVar2);
      if (bVar1) {
        pcStack_10 = "OpenGL ES 3.1";
      }
      else {
        AVar2 = ApiType::es(3,2);
        bVar1 = ApiType::operator==(&local_14,AVar2);
        if (bVar1) {
          pcStack_10 = "OpenGL ES 3.2";
        }
        else {
          AVar2 = ApiType::core(3,0);
          bVar1 = ApiType::operator==(&local_14,AVar2);
          if (bVar1) {
            pcStack_10 = "OpenGL 3.0 core";
          }
          else {
            AVar2 = ApiType::core(3,1);
            bVar1 = ApiType::operator==(&local_14,AVar2);
            if (bVar1) {
              pcStack_10 = "OpenGL 3.1 core";
            }
            else {
              AVar2 = ApiType::core(3,2);
              bVar1 = ApiType::operator==(&local_14,AVar2);
              if (bVar1) {
                pcStack_10 = "OpenGL 3.2 core";
              }
              else {
                AVar2 = ApiType::core(3,3);
                bVar1 = ApiType::operator==(&local_14,AVar2);
                if (bVar1) {
                  pcStack_10 = "OpenGL 3.3 core";
                }
                else {
                  AVar2 = ApiType::core(4,0);
                  bVar1 = ApiType::operator==(&local_14,AVar2);
                  if (bVar1) {
                    pcStack_10 = "OpenGL 4.0 core";
                  }
                  else {
                    AVar2 = ApiType::core(4,1);
                    bVar1 = ApiType::operator==(&local_14,AVar2);
                    if (bVar1) {
                      pcStack_10 = "OpenGL 4.1 core";
                    }
                    else {
                      AVar2 = ApiType::core(4,2);
                      bVar1 = ApiType::operator==(&local_14,AVar2);
                      if (bVar1) {
                        pcStack_10 = "OpenGL 4.2 core";
                      }
                      else {
                        AVar2 = ApiType::core(4,3);
                        bVar1 = ApiType::operator==(&local_14,AVar2);
                        if (bVar1) {
                          pcStack_10 = "OpenGL 4.3 core";
                        }
                        else {
                          AVar2 = ApiType::core(4,4);
                          bVar1 = ApiType::operator==(&local_14,AVar2);
                          if (bVar1) {
                            pcStack_10 = "OpenGL 4.4 core";
                          }
                          else {
                            AVar2 = ApiType::core(4,5);
                            bVar1 = ApiType::operator==(&local_14,AVar2);
                            if (bVar1) {
                              pcStack_10 = "OpenGL 4.5 core";
                            }
                            else {
                              pcStack_10 = (char *)0x0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return pcStack_10;
}

Assistant:

const char* getApiTypeDescription (ApiType type)
{
	if (type == glu::ApiType::es(2, 0))			return "OpenGL ES 2";
	else if (type == glu::ApiType::es(3, 0))	return "OpenGL ES 3";
	else if (type == glu::ApiType::es(3, 1))	return "OpenGL ES 3.1";
	else if (type == glu::ApiType::es(3, 2))	return "OpenGL ES 3.2";
	else if (type == glu::ApiType::core(3, 0))	return "OpenGL 3.0 core";
	else if (type == glu::ApiType::core(3, 1))	return "OpenGL 3.1 core";
	else if (type == glu::ApiType::core(3, 2))	return "OpenGL 3.2 core";
	else if (type == glu::ApiType::core(3, 3))	return "OpenGL 3.3 core";
	else if (type == glu::ApiType::core(4, 0))	return "OpenGL 4.0 core";
	else if (type == glu::ApiType::core(4, 1))	return "OpenGL 4.1 core";
	else if (type == glu::ApiType::core(4, 2))	return "OpenGL 4.2 core";
	else if (type == glu::ApiType::core(4, 3))	return "OpenGL 4.3 core";
	else if (type == glu::ApiType::core(4, 4))	return "OpenGL 4.4 core";
	else if (type == glu::ApiType::core(4, 5))	return "OpenGL 4.5 core";
	else										return DE_NULL;
}